

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sssort.c
# Opt level: O2

saidx64_t * ss_median3(sauchar_t *Td,saidx64_t *PA,saidx64_t *v1,saidx64_t *v2,saidx64_t *v3)

{
  long lVar1;
  long lVar2;
  long lVar3;
  saidx64_t *psVar4;
  
  lVar1 = *v1;
  lVar2 = *v2;
  psVar4 = v2;
  lVar3 = lVar2;
  if (Td[PA[lVar2]] < Td[PA[lVar1]]) {
    psVar4 = v1;
    lVar3 = lVar1;
  }
  if (Td[PA[*v3]] < Td[PA[lVar3]]) {
    if (Td[PA[lVar2]] < Td[PA[lVar1]]) {
      v1 = v2;
      lVar1 = lVar2;
    }
    psVar4 = v3;
    if (Td[PA[*v3]] < Td[PA[lVar1]]) {
      psVar4 = v1;
    }
  }
  return psVar4;
}

Assistant:

static INLINE
saidx_t *
ss_median3(const sauchar_t *Td, const saidx_t *PA,
           saidx_t *v1, saidx_t *v2, saidx_t *v3) {
  saidx_t *t;
  if(Td[PA[*v1]] > Td[PA[*v2]]) { SWAP(v1, v2); }
  if(Td[PA[*v2]] > Td[PA[*v3]]) {
    if(Td[PA[*v1]] > Td[PA[*v3]]) { return v1; }
    else { return v3; }
  }
  return v2;
}